

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t aom_highbd_get_v_sse(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b)

{
  int64_t iVar1;
  int in_stack_00000018;
  int in_stack_0000001c;
  uint8_t *in_stack_00000020;
  int in_stack_0000002c;
  uint8_t *in_stack_00000030;
  
  iVar1 = highbd_get_sse(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c,
                         in_stack_00000018,a._4_4_);
  return iVar1;
}

Assistant:

int64_t aom_highbd_get_v_sse(const YV12_BUFFER_CONFIG *a,
                             const YV12_BUFFER_CONFIG *b) {
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  assert((a->flags & YV12_FLAG_HIGHBITDEPTH) != 0);
  assert((b->flags & YV12_FLAG_HIGHBITDEPTH) != 0);

  return highbd_get_sse(a->v_buffer, a->uv_stride, b->v_buffer, b->uv_stride,
                        a->uv_crop_width, a->uv_crop_height);
}